

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O3

void showBasketList(Farm *farm)

{
  double dVar1;
  pointer pBVar2;
  ostream *poVar3;
  vector<Basket,_std::allocator<Basket>_> *__range2;
  pointer pBVar4;
  _Hash_node_base *p_Var5;
  vector<Basket,_std::allocator<Basket>_> baskets;
  Basket b;
  vector<Basket,_std::allocator<Basket>_> local_98;
  undefined1 local_80 [56];
  Basket local_48;
  
  line(0x14,'-');
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Baskets",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  line(0x14,'-');
  Farm::getBaskets((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                    *)local_80,farm);
  if ((_Hash_node_base *)local_80._16_8_ != (_Hash_node_base *)0x0) {
    p_Var5 = (_Hash_node_base *)local_80._16_8_;
    do {
      std::vector<Basket,_std::allocator<Basket>_>::vector
                (&local_98,(vector<Basket,_std::allocator<Basket>_> *)(p_Var5 + 2));
      pBVar2 = local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pBVar4 = local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                    super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
        local_48.weight = pBVar4->weight;
        local_48.client_nif = pBVar4->client_nif;
        local_48._12_4_ = *(undefined4 *)&pBVar4->field_0xc;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Client\'s NIF: ",0xe);
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var5[1]._M_nxt);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," | Weight: ",0xb);
        dVar1 = Basket::getWeight(&local_48);
        poVar3 = std::ostream::_M_insert<double>(dVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      if (local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_80);
  line(0x14,'-');
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"ENTER to go back","");
  enterWait((string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  return;
}

Assistant:

void showBasketList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (const auto& cb_pair : farm.getBaskets()) {
        vector<Basket> baskets = cb_pair.second;
        for (Basket b: baskets){
            cout << "Client's NIF: " << cb_pair.first << " | Weight: " << b.getWeight() << endl;
        }
    }
    line(20);
    enterWait();
}